

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

int * Abc_SclHashLookup(SC_Lib *p,char *pName)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  char cVar9;
  
  uVar1 = p->nBins;
  cVar9 = *pName;
  uVar3 = 0;
  if (cVar9 != '\0') {
    uVar5 = 1;
    uVar8 = 0;
    do {
      uVar3 = uVar3 + (int)cVar9 * (int)cVar9 *
                      (&Abc_SclHashString_s_Primes)[~((uVar8 / 10) * 10) + uVar5];
      uVar8 = uVar8 + 1;
      cVar9 = pName[uVar5];
      uVar5 = uVar5 + 1;
    } while (cVar9 != '\0');
  }
  uVar7 = (ulong)uVar3 % (ulong)uVar1;
  if ((int)uVar7 < (int)uVar1) {
    piVar2 = p->pBins;
    do {
      iVar6 = (int)uVar7;
      uVar3 = piVar2[iVar6];
      if ((ulong)uVar3 == 0xffffffff) {
LAB_0046db7c:
        return piVar2 + iVar6;
      }
      if (((int)uVar3 < 0) || ((p->vCells).nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar4 = strcmp(pName,*(p->vCells).pArray[uVar3]);
      if (iVar4 == 0) goto LAB_0046db7c;
      uVar7 = (long)(iVar6 + 1) % (long)(int)uVar1 & 0xffffffff;
    } while (-1 < (int)uVar1);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                ,0x3e,"int *Abc_SclHashLookup(SC_Lib *, char *)");
}

Assistant:

int * Abc_SclHashLookup( SC_Lib * p, char * pName )
{
    int i;
    for ( i = Abc_SclHashString(pName, p->nBins); i < p->nBins; i = (i + 1) % p->nBins )
        if ( p->pBins[i] == -1 || !strcmp(pName, SC_LibCell(p, p->pBins[i])->pName) )
            return p->pBins + i;
    assert( 0 );
    return NULL;
}